

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantity.cpp
# Opt level: O1

void __thiscall
polyscope::Quantity::Quantity(Quantity *this,string *name_,Structure *parentStructure_)

{
  pointer pcVar1;
  long *plVar2;
  size_type *psVar3;
  string local_68;
  string local_48;
  
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_vptr_Quantity = (_func_int **)&PTR__Quantity_005fb0d8;
  this->parent = parentStructure_;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name_->_M_string_length);
  uniquePrefix_abi_cxx11_(&local_48,this);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_68.field_2._M_allocated_capacity = *psVar3;
    local_68.field_2._8_8_ = plVar2[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar3;
    local_68._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_68._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  PersistentValue<bool>::PersistentValue(&this->enabled,&local_68,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  validateName(&this->name);
  return;
}

Assistant:

Quantity::Quantity(std::string name_, Structure& parentStructure_)
    : parent(parentStructure_), name(name_), enabled(uniquePrefix() + "enabled", false) {
  validateName(name);
}